

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IStreamingReporter *pIVar1;
  bool _aborting;
  TestRunStats TStack_78;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0016f420;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_0016f490;
  pIVar1 = (this->m_reporter).m_p;
  _aborting = aborting(this);
  TestRunStats::TestRunStats(&TStack_78,&this->m_runInfo,&this->m_totals,_aborting);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar1,&TStack_78);
  TestRunStats::~TestRunStats(&TStack_78);
  Ptr<Catch::TestCaseTracking::ITracker>::~Ptr(&(this->m_trackerContext).m_rootTracker);
  std::
  _Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~_Vector_base(&(this->m_activeSections).
                   super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                 );
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  AssertionInfo::~AssertionInfo(&this->m_lastAssertionInfo);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_config);
  AssertionResult::~AssertionResult(&this->m_lastResult);
  std::__cxx11::string::~string((string *)&this->m_runInfo);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
        }